

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSMLoader.cpp
# Opt level: O3

void __thiscall
Assimp::CSMImporter::InternReadFile
          (CSMImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  byte *pbVar1;
  undefined8 *puVar2;
  uint uVar3;
  pointer __src;
  byte bVar4;
  int iVar5;
  undefined4 extraout_var;
  aiAnimation *paVar6;
  aiVectorKey *paVar7;
  aiVectorKey *__dest;
  ulong uVar8;
  Logger *this_00;
  aiNodeAnim *paVar9;
  aiNodeAnim **__dest_00;
  aiNode *paVar10;
  aiNode **ppaVar11;
  aiNode *this_01;
  aiAnimation **ppaVar12;
  runtime_error *prVar13;
  long *plVar14;
  uint uVar15;
  ulong uVar16;
  long lVar17;
  aiNodeAnim *paVar18;
  byte bVar19;
  uint uVar20;
  uint i;
  _Alloc_hider __s2;
  byte *pbVar21;
  ulong uVar22;
  ulong uVar23;
  float d;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> anims_temp;
  vector<char,_std::allocator<char>_> mBuffer2;
  uint local_114;
  ulong local_110;
  uint local_fc;
  undefined1 local_e8 [24];
  pointer pFStack_d0;
  pointer local_b8;
  vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_> local_98;
  ulong local_80;
  aiNodeAnim *local_78;
  ulong local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  size_t local_48;
  double local_40;
  CSMImporter *local_38;
  IOStream *stream;
  
  paVar9 = (aiNodeAnim *)(local_e8 + 0x10);
  local_e8._0_8_ = paVar9;
  local_38 = this;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_e8,"rb","");
  iVar5 = (*pIOHandler->_vptr_IOSystem[4])(pIOHandler,(pFile->_M_dataplus)._M_p,local_e8._0_8_);
  stream = (IOStream *)CONCAT44(extraout_var,iVar5);
  if ((aiNodeAnim *)local_e8._0_8_ != paVar9) {
    operator_delete((void *)local_e8._0_8_);
  }
  if (stream == (IOStream *)0x0) {
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_68,"Failed to open CSM file ",pFile);
    plVar14 = (long *)std::__cxx11::string::append((char *)&local_68);
    local_e8._0_8_ = *plVar14;
    paVar18 = (aiNodeAnim *)(plVar14 + 2);
    if ((aiNodeAnim *)local_e8._0_8_ == paVar18) {
      local_e8._16_8_ = *(undefined8 *)&paVar18->mNodeName;
      pFStack_d0 = (pointer)plVar14[3];
      local_e8._0_8_ = paVar9;
    }
    else {
      local_e8._16_8_ = *(undefined8 *)&paVar18->mNodeName;
    }
    local_e8._8_8_ = plVar14[1];
    *plVar14 = (long)paVar18;
    plVar14[1] = 0;
    *(undefined1 *)(plVar14 + 2) = 0;
    std::runtime_error::runtime_error(prVar13,(string *)local_e8);
    *(undefined ***)prVar13 = &PTR__runtime_error_007fc4b8;
    __cxa_throw(prVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  local_68._M_dataplus._M_p = (pointer)0x0;
  local_68._M_string_length = 0;
  local_68.field_2._M_allocated_capacity = 0;
  BaseImporter::TextFileToBuffer
            (stream,(vector<char,_std::allocator<char>_> *)&local_68,FORBID_EMPTY);
  __s2._M_p = local_68._M_dataplus._M_p;
  paVar6 = (aiAnimation *)operator_new(0x448);
  (paVar6->mName).length = 0;
  (paVar6->mName).data[0] = '\0';
  memset((paVar6->mName).data + 1,0x1b,0x3ff);
  paVar6->mDuration = -1.0;
  paVar6->mTicksPerSecond = 0.0;
  paVar6->mNumChannels = 0;
  paVar6->mChannels = (aiNodeAnim **)0x0;
  paVar6->mNumMeshChannels = 0;
  paVar6->mMeshChannels = (aiMeshAnim **)0x0;
  paVar6->mNumMorphMeshChannels = 0;
  paVar6->mMorphMeshChannels = (aiMeshMorphAnim **)0x0;
  local_114 = 0xffffff;
  uVar20 = 0;
LAB_0041f5c5:
  do {
    pbVar21 = (byte *)__s2._M_p;
    bVar4 = *pbVar21;
    if (0x1f < bVar4) {
      if (bVar4 == 0x20) {
LAB_0041f5dc:
        __s2._M_p = (pointer)(pbVar21 + 1);
      }
      else {
        if (bVar4 != 0x24) goto LAB_0041fa40;
        __s2._M_p = (pointer)(pbVar21 + 1);
        iVar5 = strncasecmp("firstframe",__s2._M_p,10);
        if (((iVar5 == 0) && ((ulong)pbVar21[0xb] < 0x21)) &&
           ((0x100003601U >> ((ulong)pbVar21[0xb] & 0x3f) & 1) != 0)) {
          for (pbVar21 = pbVar21 + 0xc; (bVar4 = *pbVar21, bVar4 == 0x20 || (bVar4 == 9));
              pbVar21 = pbVar21 + 1) {
          }
          __s2._M_p = (pointer)(pbVar21 + ((bVar4 - 0x2b & 0xfd) == 0));
          bVar19 = *__s2._M_p;
          uVar15 = 0;
          if (0xf5 < (byte)(bVar19 - 0x3a)) {
            uVar15 = 0;
            do {
              uVar15 = (uint)(byte)(bVar19 - 0x30) + uVar15 * 10;
              bVar19 = ((byte *)__s2._M_p)[1];
              __s2._M_p = __s2._M_p + 1;
            } while (0xf5 < (byte)(bVar19 - 0x3a));
          }
          uVar20 = -uVar15;
          if (bVar4 != 0x2d) {
            uVar20 = uVar15;
          }
        }
        else {
          iVar5 = strncasecmp("lastframe",__s2._M_p,9);
          if (((iVar5 == 0) && ((ulong)pbVar21[10] < 0x21)) &&
             ((0x100003601U >> ((ulong)pbVar21[10] & 0x3f) & 1) != 0)) {
            for (pbVar21 = pbVar21 + 0xb; (bVar4 = *pbVar21, bVar4 == 0x20 || (bVar4 == 9));
                pbVar21 = pbVar21 + 1) {
            }
            __s2._M_p = (pointer)(pbVar21 + ((bVar4 - 0x2b & 0xfd) == 0));
            bVar19 = *__s2._M_p;
            uVar15 = 0;
            if (0xf5 < (byte)(bVar19 - 0x3a)) {
              uVar15 = 0;
              do {
                uVar15 = (uint)(byte)(bVar19 - 0x30) + uVar15 * 10;
                bVar19 = ((byte *)__s2._M_p)[1];
                __s2._M_p = __s2._M_p + 1;
              } while (0xf5 < (byte)(bVar19 - 0x3a));
            }
            local_114 = -uVar15;
            if (bVar4 != 0x2d) {
              local_114 = uVar15;
            }
          }
          else {
            iVar5 = strncasecmp("rate",__s2._M_p,4);
            if (((iVar5 == 0) && ((ulong)pbVar21[5] < 0x21)) &&
               ((0x100003601U >> ((ulong)pbVar21[5] & 0x3f) & 1) != 0)) {
              for (pbVar21 = pbVar21 + 6; (*pbVar21 == 0x20 || (*pbVar21 == 9));
                  pbVar21 = pbVar21 + 1) {
              }
              __s2._M_p = fast_atoreal_move<float>((char *)pbVar21,(float *)local_e8,true);
              paVar6->mTicksPerSecond = (double)(float)local_e8._0_4_;
            }
            else {
              iVar5 = strncasecmp("order",__s2._M_p,5);
              if (((iVar5 == 0) && ((ulong)pbVar21[6] < 0x21)) &&
                 ((0x100003601U >> ((ulong)pbVar21[6] & 0x3f) & 1) != 0)) {
                local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                super__Vector_impl_data._M_finish = (aiNodeAnim **)0x0;
                local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (aiNodeAnim **)0x0;
                std::vector<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>::reserve(&local_98,0x1e);
                __s2._M_p = (pointer)(pbVar21 + 7);
LAB_0041fc3d:
                do {
                  __src = local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                          _M_impl.super__Vector_impl_data._M_start;
                  uVar22 = (ulong)(byte)*__s2._M_p;
                  if (uVar22 < 0x21) {
                    if ((0x3401UL >> (uVar22 & 0x3f) & 1) == 0) {
                      if ((0x100000200U >> (uVar22 & 0x3f) & 1) != 0) {
                        __s2._M_p = __s2._M_p + 1;
                        goto LAB_0041fc3d;
                      }
                    }
                    else {
                      while ((byte)uVar22 < 0x25) {
                        if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
                          if (uVar22 == 0x24) {
                            uVar15 = (uint)((ulong)((long)local_98.
                                                  super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_98.
                                                  super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 3);
                            paVar6->mNumChannels = uVar15;
                            if (uVar15 == 0) {
                              prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                              local_e8._0_8_ = local_e8 + 0x10;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_e8,"CSM: Empty $order section","");
                              std::runtime_error::runtime_error(prVar13,(string *)local_e8);
                              *(undefined ***)prVar13 = &PTR__runtime_error_007fc4b8;
                              __cxa_throw(prVar13,&DeadlyImportError::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            __dest_00 = (aiNodeAnim **)
                                        operator_new__((long)local_98.
                                                  super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                                  (long)local_98.
                                                  super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start &
                                                  0x7fffffff8);
                            paVar6->mChannels = __dest_00;
                            memcpy(__dest_00,__src,(ulong)paVar6->mNumChannels << 3);
                            if (__src != (pointer)0x0) {
                              operator_delete(__src);
                            }
                            goto LAB_0041f5c5;
                          }
                          break;
                        }
                        pbVar21 = (byte *)__s2._M_p + 1;
                        __s2._M_p = __s2._M_p + 1;
                        uVar22 = (ulong)*pbVar21;
                      }
                    }
                  }
                  paVar9 = (aiNodeAnim *)operator_new(0x438);
                  (paVar9->mNodeName).length = 0;
                  (paVar9->mNodeName).data[0] = '\0';
                  memset((paVar9->mNodeName).data + 1,0x1b,0x3ff);
                  paVar9->mRotationKeys = (aiQuatKey *)0x0;
                  paVar9->mNumScalingKeys = 0;
                  *(undefined8 *)&paVar9->mNumPositionKeys = 0;
                  *(undefined8 *)((long)&paVar9->mPositionKeys + 4) = 0;
                  paVar9->mScalingKeys = (aiVectorKey *)0x0;
                  paVar9->mPreState = aiAnimBehaviour_DEFAULT;
                  paVar9->mPostState = aiAnimBehaviour_DEFAULT;
                  local_e8._0_8_ = paVar9;
                  if (local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                      _M_impl.super__Vector_impl_data._M_finish ==
                      local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage) {
                    std::vector<aiNodeAnim*,std::allocator<aiNodeAnim*>>::
                    _M_realloc_insert<aiNodeAnim*>
                              ((vector<aiNodeAnim*,std::allocator<aiNodeAnim*>> *)&local_98,
                               (iterator)
                               local_98.
                               super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                               _M_impl.super__Vector_impl_data._M_finish,(aiNodeAnim **)local_e8);
                  }
                  else {
                    *local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                     _M_impl.super__Vector_impl_data._M_finish = paVar9;
                    local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>._M_impl
                    .super__Vector_impl_data._M_finish =
                         local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                         _M_impl.super__Vector_impl_data._M_finish + 1;
                  }
                  paVar9 = local_98.super__Vector_base<aiNodeAnim_*,_std::allocator<aiNodeAnim_*>_>.
                           _M_impl.super__Vector_impl_data._M_finish[-1];
                  lVar17 = 0;
                  while( true ) {
                    bVar4 = ((byte *)__s2._M_p)[lVar17];
                    if (((ulong)bVar4 < 0x21) && ((0x100003601U >> ((ulong)bVar4 & 0x3f) & 1) != 0))
                    break;
                    (paVar9->mNodeName).data[lVar17] = bVar4;
                    lVar17 = lVar17 + 1;
                  }
                  (paVar9->mNodeName).data[lVar17] = '\0';
                  (paVar9->mNodeName).length = (ai_uint32)lVar17;
                  __s2._M_p = __s2._M_p + lVar17;
                } while( true );
              }
              iVar5 = strncasecmp("points",__s2._M_p,6);
              if (((iVar5 == 0) && ((ulong)pbVar21[7] < 0x21)) &&
                 ((0x100003601U >> ((ulong)pbVar21[7] & 0x3f) & 1) != 0)) {
                if (paVar6->mNumChannels == 0) {
                  prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                  local_e8._0_8_ = local_e8 + 0x10;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)local_e8,
                             "CSM: \'$order\' section is required to appear prior to \'$points\'",""
                            );
                  std::runtime_error::runtime_error(prVar13,(string *)local_e8);
                  *(undefined ***)prVar13 = &PTR__runtime_error_007fc4b8;
                  __cxa_throw(prVar13,&DeadlyImportError::typeinfo,
                              std::runtime_error::~runtime_error);
                }
                local_110 = 100;
                if (local_114 != 0xffffff) {
                  uVar15 = (local_114 - uVar20 >> 2) + (local_114 - uVar20);
                  local_110 = (ulong)uVar15;
                  uVar22 = 0;
                  do {
                    paVar7 = (aiVectorKey *)operator_new__(local_110 * 0x18);
                    if (uVar15 != 0) {
                      uVar16 = 0;
                      do {
                        puVar2 = (undefined8 *)((long)&paVar7->mTime + uVar16);
                        *puVar2 = 0;
                        puVar2[1] = 0;
                        *(undefined4 *)((long)&(paVar7->mValue).z + uVar16) = 0;
                        uVar16 = uVar16 + 0x18;
                      } while (local_110 * 0x18 != uVar16);
                    }
                    paVar6->mChannels[uVar22]->mPositionKeys = paVar7;
                    uVar22 = uVar22 + 1;
                  } while (uVar22 < paVar6->mNumChannels);
                }
                __s2._M_p = (pointer)(pbVar21 + 8);
                local_fc = 0;
                do {
                  while (uVar22 = (ulong)(byte)*__s2._M_p, 0x20 < uVar22) {
LAB_0041f7a7:
                    uVar20 = 0;
                    if (0xf5 < (byte)((char)uVar22 - 0x3aU)) {
                      uVar20 = 0;
                      do {
                        uVar20 = (uint)(byte)((char)uVar22 - 0x30) + uVar20 * 10;
                        pbVar21 = (byte *)__s2._M_p + 1;
                        uVar22 = (ulong)*pbVar21;
                        __s2._M_p = __s2._M_p + 1;
                      } while (0xf5 < (byte)(*pbVar21 - 0x3a));
                    }
                    if ((int)local_114 < (int)uVar20) {
                      local_114 = uVar20;
                    }
                    uVar15 = (uint)local_110;
                    if (paVar6->mNumChannels != 0) {
                      uVar16 = (ulong)(uVar15 * 2);
                      uVar22 = uVar16 * 0x18;
                      local_48 = local_110 * 0x18;
                      local_40 = (double)(int)uVar20;
                      uVar23 = 0;
                      local_80 = uVar16;
                      do {
                        local_78 = paVar6->mChannels[uVar23];
                        if (local_78->mNumPositionKeys == uVar15) {
                          paVar7 = local_78->mPositionKeys;
                          local_78->mNumPositionKeys = (uint)uVar16;
                          local_70 = uVar23;
                          __dest = (aiVectorKey *)operator_new__(uVar22);
                          if ((uint)uVar16 != 0) {
                            uVar16 = 0;
                            do {
                              puVar2 = (undefined8 *)((long)&__dest->mTime + uVar16);
                              *puVar2 = 0;
                              puVar2[1] = 0;
                              *(undefined4 *)((long)&(__dest->mValue).z + uVar16) = 0;
                              uVar16 = uVar16 + 0x18;
                            } while (uVar22 != uVar16);
                          }
                          local_78->mPositionKeys = __dest;
                          memcpy(__dest,paVar7,local_48);
                          uVar16 = local_80;
                          uVar23 = local_70;
                          if (paVar7 != (aiVectorKey *)0x0) {
                            operator_delete__(paVar7);
                            uVar16 = local_80;
                            uVar23 = local_70;
                          }
                        }
                        for (; uVar8 = (ulong)(byte)*__s2._M_p, uVar8 < 0x21;
                            __s2._M_p = __s2._M_p + 1) {
                          if ((0x100002600U >> (uVar8 & 0x3f) & 1) == 0) {
                            if (uVar8 == 0) {
                              prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                              local_e8._0_8_ = local_e8 + 0x10;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)local_e8,
                                         "CSM: Unexpected EOF occurred reading sample x coord","");
                              std::runtime_error::runtime_error(prVar13,(string *)local_e8);
                              *(undefined ***)prVar13 = &PTR__runtime_error_007fc4b8;
                              __cxa_throw(prVar13,&DeadlyImportError::typeinfo,
                                          std::runtime_error::~runtime_error);
                            }
                            break;
                          }
                        }
                        iVar5 = strncasecmp("DROPOUT",__s2._M_p,7);
                        if (((iVar5 == 0) && ((ulong)((byte *)__s2._M_p)[7] < 0x21)) &&
                           ((0x100003601U >> ((ulong)((byte *)__s2._M_p)[7] & 0x3f) & 1) != 0)) {
                          this_00 = DefaultLogger::get();
                          Logger::warn(this_00,"CSM: Encountered invalid marker data (DROPOUT)");
                          __s2._M_p = __s2._M_p + 8;
                        }
                        else {
                          paVar7 = local_78->mPositionKeys;
                          uVar3 = local_78->mNumPositionKeys;
                          paVar7[uVar3].mTime = local_40;
                          for (pbVar21 = (byte *)fast_atoreal_move<float>
                                                           (__s2._M_p,&paVar7[uVar3].mValue.x,true);
                              uVar16 = (ulong)*pbVar21, uVar16 < 0x21; pbVar21 = pbVar21 + 1) {
                            if ((0x100002600U >> (uVar16 & 0x3f) & 1) == 0) {
                              if (uVar16 == 0) {
                                prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                                local_e8._0_8_ = local_e8 + 0x10;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_e8,
                                           "CSM: Unexpected EOF occurred reading sample y coord","")
                                ;
                                std::runtime_error::runtime_error(prVar13,(string *)local_e8);
                                *(undefined ***)prVar13 = &PTR__runtime_error_007fc4b8;
                                __cxa_throw(prVar13,&DeadlyImportError::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              break;
                            }
                          }
                          for (pbVar21 = (byte *)fast_atoreal_move<float>
                                                           ((char *)pbVar21,&paVar7[uVar3].mValue.y,
                                                            true); uVar16 = (ulong)*pbVar21,
                              uVar16 < 0x21; pbVar21 = pbVar21 + 1) {
                            if ((0x100002600U >> (uVar16 & 0x3f) & 1) == 0) {
                              if (uVar16 == 0) {
                                prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                                local_e8._0_8_ = local_e8 + 0x10;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)local_e8,
                                           "CSM: Unexpected EOF occurred reading sample z coord","")
                                ;
                                std::runtime_error::runtime_error(prVar13,(string *)local_e8);
                                *(undefined ***)prVar13 = &PTR__runtime_error_007fc4b8;
                                __cxa_throw(prVar13,&DeadlyImportError::typeinfo,
                                            std::runtime_error::~runtime_error);
                              }
                              break;
                            }
                          }
                          __s2._M_p = fast_atoreal_move<float>
                                                ((char *)pbVar21,&paVar7[uVar3].mValue.z,true);
                          local_78->mNumPositionKeys = local_78->mNumPositionKeys + 1;
                          uVar16 = local_80;
                        }
                        uVar23 = uVar23 + 1;
                      } while (uVar23 < paVar6->mNumChannels);
                    }
                    local_110 = (ulong)(uVar15 << (local_fc == uVar15));
                    local_fc = local_fc + 1;
                  }
                  if ((0x100000200U >> (uVar22 & 0x3f) & 1) == 0) {
                    if ((0x3401UL >> (uVar22 & 0x3f) & 1) != 0) {
                      while ((byte)uVar22 < 0x25) {
                        if ((0x100002600U >> (uVar22 & 0x3f) & 1) == 0) {
                          if ((0x1000000001U >> (uVar22 & 0x3f) & 1) != 0) {
                            if ((ulong)paVar6->mNumChannels != 0) {
                              uVar22 = 0;
                              do {
                                if (paVar6->mChannels[uVar22]->mNumPositionKeys == 0) {
                                  prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
                                  local_e8._0_8_ = local_e8 + 0x10;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)local_e8,"CSM: Invalid marker track","");
                                  std::runtime_error::runtime_error(prVar13,(string *)local_e8);
                                  *(undefined ***)prVar13 = &PTR__runtime_error_007fc4b8;
                                  __cxa_throw(prVar13,&DeadlyImportError::typeinfo,
                                              std::runtime_error::~runtime_error);
                                }
                                uVar22 = uVar22 + 1;
                              } while (paVar6->mNumChannels != uVar22);
                            }
                            goto LAB_0041f5c5;
                          }
                          break;
                        }
                        pbVar21 = (byte *)__s2._M_p + 1;
                        __s2._M_p = __s2._M_p + 1;
                        uVar22 = (ulong)*pbVar21;
                      }
                    }
                    goto LAB_0041f7a7;
                  }
                  __s2._M_p = __s2._M_p + 1;
                } while( true );
              }
            }
          }
        }
      }
      goto LAB_0041f5c5;
    }
    if (bVar4 == 9) goto LAB_0041f5dc;
    if (bVar4 == 0) {
      paVar6->mDuration = (double)(int)(local_114 - ((int)uVar20 >> 0x1f & uVar20));
      paVar10 = (aiNode *)operator_new(0x478);
      aiNode::aiNode(paVar10);
      pScene->mRootNode = paVar10;
      (paVar10->mName).length = 0xe;
      builtin_strncpy((paVar10->mName).data,"$CSM_DummyRoot",0xf);
      uVar20 = paVar6->mNumChannels;
      paVar10->mNumChildren = uVar20;
      ppaVar11 = (aiNode **)operator_new__((ulong)uVar20 << 3);
      paVar10->mChildren = ppaVar11;
      if (paVar6->mNumChannels != 0) {
        uVar22 = 0;
        do {
          paVar9 = paVar6->mChannels[uVar22];
          this_01 = (aiNode *)operator_new(0x478);
          aiNode::aiNode(this_01);
          pScene->mRootNode->mChildren[uVar22] = this_01;
          paVar10 = (aiNode *)paVar6->mChannels[uVar22];
          if (this_01 != paVar10) {
            uVar20 = (paVar10->mName).length;
            (this_01->mName).length = uVar20;
            memcpy((this_01->mName).data,(paVar10->mName).data,(ulong)uVar20);
            (this_01->mName).data[uVar20] = '\0';
          }
          this_01->mParent = pScene->mRootNode;
          paVar7 = paVar9->mPositionKeys;
          (this_01->mTransformation).a1 = 1.0;
          (this_01->mTransformation).a2 = 0.0;
          (this_01->mTransformation).a3 = 0.0;
          (this_01->mTransformation).a4 = 0.0;
          (this_01->mTransformation).b1 = 0.0;
          (this_01->mTransformation).b2 = 1.0;
          (this_01->mTransformation).b3 = 0.0;
          (this_01->mTransformation).b4 = 0.0;
          (this_01->mTransformation).c1 = 0.0;
          (this_01->mTransformation).c2 = 0.0;
          (this_01->mTransformation).c3 = 1.0;
          (this_01->mTransformation).c4 = 0.0;
          (this_01->mTransformation).d1 = 0.0;
          (this_01->mTransformation).d2 = 0.0;
          (this_01->mTransformation).d3 = 0.0;
          (this_01->mTransformation).d4 = 1.0;
          (this_01->mTransformation).a4 = (paVar7->mValue).x;
          (this_01->mTransformation).b4 = (paVar7->mValue).y;
          (this_01->mTransformation).c4 = (paVar7->mValue).z;
          uVar22 = uVar22 + 1;
        } while (uVar22 < paVar6->mNumChannels);
      }
      pScene->mNumAnimations = 1;
      ppaVar12 = (aiAnimation **)operator_new__(8);
      pScene->mAnimations = ppaVar12;
      (paVar6->mName).length = 0xf;
      builtin_strncpy((paVar6->mName).data,"$CSM_MasterAnim",0x10);
      *pScene->mAnimations = paVar6;
      *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 1;
      if (local_38->noSkeletonMesh == false) {
        SkeletonMeshBuilder::SkeletonMeshBuilder
                  ((SkeletonMeshBuilder *)local_e8,pScene,pScene->mRootNode,true);
        if (local_b8 != (pointer)0x0) {
          operator_delete(local_b8);
        }
        if (pFStack_d0 != (pointer)0x0) {
          operator_delete(pFStack_d0);
        }
        if ((aiNodeAnim *)local_e8._0_8_ != (aiNodeAnim *)0x0) {
          operator_delete((void *)local_e8._0_8_);
        }
      }
      if ((byte *)local_68._M_dataplus._M_p != (byte *)0x0) {
        operator_delete(local_68._M_dataplus._M_p);
      }
      (*stream->_vptr_IOStream[1])(stream);
      return;
    }
LAB_0041fa40:
    while ((0xd < bVar4 || ((0x2401U >> (bVar4 & 0x1f) & 1) == 0))) {
      bVar4 = pbVar21[1];
      pbVar21 = pbVar21 + 1;
    }
    while ((bVar4 == 0xd || (__s2._M_p = (pointer)pbVar21, bVar4 == 10))) {
      pbVar1 = pbVar21 + 1;
      pbVar21 = pbVar21 + 1;
      bVar4 = *pbVar1;
    }
  } while( true );
}

Assistant:

void CSMImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    std::unique_ptr<IOStream> file( pIOHandler->Open( pFile, "rb"));

    // Check whether we can read from the file
    if( file.get() == NULL) {
        throw DeadlyImportError( "Failed to open CSM file " + pFile + ".");
    }

    // allocate storage and copy the contents of the file to a memory buffer
    std::vector<char> mBuffer2;
    TextFileToBuffer(file.get(),mBuffer2);
    const char* buffer = &mBuffer2[0];

    std::unique_ptr<aiAnimation> anim(new aiAnimation());
    int first = 0, last = 0x00ffffff;

    // now process the file and look out for '$' sections
    while (1)   {
        SkipSpaces(&buffer);
        if ('\0' == *buffer)
            break;

        if ('$'  == *buffer)    {
            ++buffer;
            if (TokenMatchI(buffer,"firstframe",10))    {
                SkipSpaces(&buffer);
                first = strtol10(buffer,&buffer);
            }
            else if (TokenMatchI(buffer,"lastframe",9))     {
                SkipSpaces(&buffer);
                last = strtol10(buffer,&buffer);
            }
            else if (TokenMatchI(buffer,"rate",4))  {
                SkipSpaces(&buffer);
                float d;
                buffer = fast_atoreal_move<float>(buffer,d);
                anim->mTicksPerSecond = d;
            }
            else if (TokenMatchI(buffer,"order",5)) {
                std::vector< aiNodeAnim* > anims_temp;
                anims_temp.reserve(30);
                while (1)   {
                    SkipSpaces(&buffer);
                    if (IsLineEnd(*buffer) && SkipSpacesAndLineEnd(&buffer) && *buffer == '$')
                        break; // next section

                    // Construct a new node animation channel and setup its name
                    anims_temp.push_back(new aiNodeAnim());
                    aiNodeAnim* nda = anims_temp.back();

                    char* ot = nda->mNodeName.data;
                    while (!IsSpaceOrNewLine(*buffer))
                        *ot++ = *buffer++;

                    *ot = '\0';
                    nda->mNodeName.length = (size_t)(ot-nda->mNodeName.data);
                }

                anim->mNumChannels = static_cast<unsigned int>(anims_temp.size());
                if (!anim->mNumChannels)
                    throw DeadlyImportError("CSM: Empty $order section");

                // copy over to the output animation
                anim->mChannels = new aiNodeAnim*[anim->mNumChannels];
                ::memcpy(anim->mChannels,&anims_temp[0],sizeof(aiNodeAnim*)*anim->mNumChannels);
            }
            else if (TokenMatchI(buffer,"points",6))    {
                if (!anim->mNumChannels)
                    throw DeadlyImportError("CSM: \'$order\' section is required to appear prior to \'$points\'");

                // If we know how many frames we'll read, we can preallocate some storage
                unsigned int alloc = 100;
                if (last != 0x00ffffff)
                {
                    alloc = last-first;
                    alloc += alloc>>2u; // + 25%
                    for (unsigned int i = 0; i < anim->mNumChannels;++i)
                        anim->mChannels[i]->mPositionKeys = new aiVectorKey[alloc];
                }

                unsigned int filled = 0;

                // Now read all point data.
                while (1)   {
                    SkipSpaces(&buffer);
                    if (IsLineEnd(*buffer) && (!SkipSpacesAndLineEnd(&buffer) || *buffer == '$'))   {
                        break; // next section
                    }

                    // read frame
                    const int frame = ::strtoul10(buffer,&buffer);
                    last  = std::max(frame,last);
                    first = std::min(frame,last);
                    for (unsigned int i = 0; i < anim->mNumChannels;++i)    {

                        aiNodeAnim* s = anim->mChannels[i];
                        if (s->mNumPositionKeys == alloc)   { /* need to reallocate? */

                            aiVectorKey* old = s->mPositionKeys;
                            s->mPositionKeys = new aiVectorKey[s->mNumPositionKeys = alloc*2];
                            ::memcpy(s->mPositionKeys,old,sizeof(aiVectorKey)*alloc);
                            delete[] old;
                        }

                        // read x,y,z
                        if(!SkipSpacesAndLineEnd(&buffer))
                            throw DeadlyImportError("CSM: Unexpected EOF occurred reading sample x coord");

                        if (TokenMatchI(buffer, "DROPOUT", 7))  {
                            // seems this is invalid marker data; at least the doc says it's possible
                            ASSIMP_LOG_WARN("CSM: Encountered invalid marker data (DROPOUT)");
                        }
                        else    {
                            aiVectorKey* sub = s->mPositionKeys + s->mNumPositionKeys;
                            sub->mTime = (double)frame;
                            buffer = fast_atoreal_move<float>(buffer, (float&)sub->mValue.x);

                            if(!SkipSpacesAndLineEnd(&buffer))
                                throw DeadlyImportError("CSM: Unexpected EOF occurred reading sample y coord");
                            buffer = fast_atoreal_move<float>(buffer, (float&)sub->mValue.y);

                            if(!SkipSpacesAndLineEnd(&buffer))
                                throw DeadlyImportError("CSM: Unexpected EOF occurred reading sample z coord");
                            buffer = fast_atoreal_move<float>(buffer, (float&)sub->mValue.z);

                            ++s->mNumPositionKeys;
                        }
                    }

                    // update allocation granularity
                    if (filled == alloc)
                        alloc *= 2;

                    ++filled;
                }
                // all channels must be complete in order to continue safely.
                for (unsigned int i = 0; i < anim->mNumChannels;++i)    {

                    if (!anim->mChannels[i]->mNumPositionKeys)
                        throw DeadlyImportError("CSM: Invalid marker track");
                }
            }
        }
        else    {
            // advance to the next line
            SkipLine(&buffer);
        }
    }

    // Setup a proper animation duration
    anim->mDuration = last - std::min( first, 0 );

    // build a dummy root node with the tiny markers as children
    pScene->mRootNode = new aiNode();
    pScene->mRootNode->mName.Set("$CSM_DummyRoot");

    pScene->mRootNode->mNumChildren = anim->mNumChannels;
    pScene->mRootNode->mChildren = new aiNode* [anim->mNumChannels];

    for (unsigned int i = 0; i < anim->mNumChannels;++i)    {
        aiNodeAnim* na = anim->mChannels[i];

        aiNode* nd  = pScene->mRootNode->mChildren[i] = new aiNode();
        nd->mName   = anim->mChannels[i]->mNodeName;
        nd->mParent = pScene->mRootNode;

        aiMatrix4x4::Translation(na->mPositionKeys[0].mValue, nd->mTransformation);
    }

    // Store the one and only animation in the scene
    pScene->mAnimations    = new aiAnimation*[pScene->mNumAnimations=1];
    anim->mName.Set("$CSM_MasterAnim");
    pScene->mAnimations[0] = anim.release();

    // mark the scene as incomplete and run SkeletonMeshBuilder on it
    pScene->mFlags |= AI_SCENE_FLAGS_INCOMPLETE;

    if (!noSkeletonMesh) {
        SkeletonMeshBuilder maker(pScene,pScene->mRootNode,true);
    }
}